

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandPoolManager.cpp
# Opt level: O2

void __thiscall
Diligent::CommandPoolManager::CommandPoolManager(CommandPoolManager *this,CreateInfo *CI)

{
  allocator_type local_30;
  
  this->m_LogicalDevice = CI->LogicalDevice;
  std::__cxx11::string::string((string *)&this->m_Name,(string *)&CI->Name);
  (this->m_QueueFamilyIndex).m_Value = (CI->queueFamilyIndex).m_Value;
  this->m_CmdPoolFlags = CI->flags;
  (this->m_Mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_Mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_Mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_30.m_Allocator = GetRawAllocator();
  local_30.m_dvpDescription = "Allocator for deque<VulkanUtilities::CommandPoolWrapper>";
  local_30.m_dvpFileName =
       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandPoolManager.cpp"
  ;
  local_30.m_dvpLineNumber = 0x2a;
  std::
  deque<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>_>
  ::deque(&this->m_CmdPools,&local_30);
  (this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i = 0;
  return;
}

Assistant:

CommandPoolManager::CommandPoolManager(const CreateInfo& CI) noexcept :
    // clang-format off
    m_LogicalDevice   {CI.LogicalDevice   },
    m_Name            {CI.Name            },
    m_QueueFamilyIndex{CI.queueFamilyIndex},
    m_CmdPoolFlags    {CI.flags           },
    m_CmdPools        (STD_ALLOCATOR_RAW_MEM(VulkanUtilities::CommandPoolWrapper, GetRawAllocator(), "Allocator for deque<VulkanUtilities::CommandPoolWrapper>"))
// clang-format on
{
}